

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monmove.c
# Opt level: O0

int dochugw(monst *mtmp)

{
  char cVar1;
  char cVar2;
  boolean bVar3;
  byte bVar4;
  int iVar5;
  obj *poVar6;
  bool bVar7;
  int rd;
  boolean already_saw_mon;
  int y;
  int x;
  monst *mtmp_local;
  
  cVar1 = mtmp->mx;
  cVar2 = mtmp->my;
  if (occupation == (_func_int *)0x0) {
    bVar7 = false;
  }
  else {
    if (mtmp->wormno == '\0') {
      if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00252935;
      if (((((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
          ((u.uprops[0x40].intrinsic != 0 ||
           ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))))) &&
         ((mtmp->data->mflags3 & 0x200) != 0)) {
        bVar4 = viz_array[mtmp->my][mtmp->mx] & 1;
        goto joined_r0x0025292f;
      }
    }
    else {
      bVar4 = worm_known(level,mtmp);
joined_r0x0025292f:
      if (bVar4 != 0) {
LAB_00252935:
        if (((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
              (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
            (((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
             ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)))) &&
           (bVar7 = true, ((byte)u._1052_1_ >> 5 & 1) == 0)) goto LAB_00252bb5;
      }
    }
    if (((mtmp->data->mflags1 & 0x10000) == 0) &&
       ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
        (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) {
      if (((u.uprops[0x1e].intrinsic != 0) ||
          (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
           (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
         (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
          ((((u.uprops[0x19].intrinsic != 0 ||
             ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
            ((youmonst.data == mons + 0x31 || (youmonst.data == mons + 0x32)))) &&
           (bVar7 = true, u.uprops[0x19].blocked == 0)))))) goto LAB_00252bb5;
      if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
        iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
        bVar7 = true;
        if (iVar5 < 0x41) goto LAB_00252bb5;
      }
    }
    bVar7 = true;
    if ((u.uprops[0x42].intrinsic == 0) && (bVar7 = true, u.uprops[0x42].extrinsic == 0)) {
      bVar3 = match_warn_of_mon(mtmp);
      bVar7 = bVar3 != '\0';
    }
  }
LAB_00252bb5:
  iVar5 = dochug(mtmp);
  if (occupation == (_func_int *)0x0) {
    return iVar5;
  }
  if (iVar5 != 0) {
    return iVar5;
  }
  if (u.uprops[0x1c].intrinsic != 0) {
    return 0;
  }
  if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) != 0) {
    if (u.uprops[0x23].intrinsic == 0) {
      return 0;
    }
    if (u.uprops[0x24].extrinsic != 0) {
      return 0;
    }
    if ((u.umonnum != u.umonster) && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')) {
      return 0;
    }
  }
  iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
  if (0x51 < iVar5) {
    return 0;
  }
  if (((bVar7) && ((viz_array[(int)cVar2][(int)cVar1] & 1U) != 0)) &&
     (iVar5 = dist2((int)cVar1,(int)cVar2,(int)u.ux,(int)u.uy), iVar5 < 0x52)) {
    return 0;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_00252e4d;
    if (((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
         && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
        ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
       (((u.uprops[0x40].intrinsic != 0 ||
         ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        ((mtmp->data->mflags3 & 0x200) != 0)))) {
      bVar4 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x00252e47;
    }
  }
  else {
    bVar4 = worm_known(level,mtmp);
joined_r0x00252e47:
    if (bVar4 != 0) {
LAB_00252e4d:
      if ((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
         ((((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 &&
           ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0))))
      goto LAB_002530c9;
    }
  }
  if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
       ((poVar6 = which_armor(mtmp,4), poVar6 != (obj *)0x0 &&
        (poVar6 = which_armor(mtmp,4), poVar6->otyp == 0x4f)))) ||
      ((((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) ||
         ((((u.uprops[0x19].intrinsic == 0 &&
            ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
           (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))) ||
        (u.uprops[0x19].blocked != 0)) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar5 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar5)))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      (bVar3 = match_warn_of_mon(mtmp), bVar3 == '\0')))) {
    return 0;
  }
  if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
    return 0;
  }
LAB_002530c9:
  if ((((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) != 0) &&
      (iVar5 = noattacks(mtmp->data), iVar5 == 0)) &&
     (bVar3 = onscary((int)u.ux,(int)u.uy,mtmp), bVar3 == '\0')) {
    stop_occupation();
  }
  return 0;
}

Assistant:

int dochugw(struct monst *mtmp)
{
	int x = mtmp->mx, y = mtmp->my;
	boolean already_saw_mon = !occupation ? 0 : canspotmon(level, mtmp);
	int rd = dochug(mtmp);

	/* a similar check is in monster_nearby() in hack.c */
	/* check whether hero notices monster and stops current activity */
	if (occupation && !rd && !Confusion &&
	    (!mtmp->mpeaceful || Hallucination) &&
	    /* it's close enough to be a threat */
	    distu(mtmp->mx,mtmp->my) <= (BOLT_LIM+1)*(BOLT_LIM+1) &&
	    /* and either couldn't see it before, or it was too far away */
	    (!already_saw_mon || !couldsee(x,y) ||
		distu(x,y) > (BOLT_LIM+1)*(BOLT_LIM+1)) &&
	    /* can see it now, or sense it and would normally see it */
	    (canseemon(level, mtmp) ||
		(sensemon(mtmp) && couldsee(mtmp->mx,mtmp->my))) &&
	    mtmp->mcanmove &&
	    !noattacks(mtmp->data) && !onscary(u.ux, u.uy, mtmp))
		stop_occupation();

	return rd;
}